

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tts.cpp
# Opt level: O0

vector<float,_std::allocator<float>_> *
embd_to_audio(float *embd,int n_codes,int n_embd,int n_thread)

{
  long n_out_00;
  long n_hop_00;
  reference pvVar1;
  thread *this;
  vector<float,_std::allocator<float>_> *this_00;
  allocator_type *__a;
  size_type sVar2;
  int in_ECX;
  int in_EDX;
  long in_RSI;
  vector<float,_std::allocator<float>_> *in_RDI;
  int in_R8D;
  float fVar3;
  float fVar4;
  double dVar5;
  size_t i_2;
  vector<float,_std::allocator<float>_> env;
  int i_1;
  int i;
  vector<std::thread,_std::allocator<std::thread>_> workers;
  vector<float,_std::allocator<float>_> hann2;
  vector<float,_std::allocator<float>_> res;
  int k_2;
  int l_2;
  float phi;
  float mag;
  int l_1;
  int k_1;
  int k;
  int l;
  vector<float,_std::allocator<float>_> ST;
  vector<float,_std::allocator<float>_> S;
  vector<float,_std::allocator<float>_> E;
  int n_spec;
  vector<float,_std::allocator<float>_> hann;
  int n_out;
  int n_pad;
  int n_win;
  int n_hop;
  int n_fft;
  vector<float,_std::allocator<float>_> *audio;
  thread *in_stack_fffffffffffffd88;
  undefined4 in_stack_fffffffffffffd90;
  int in_stack_fffffffffffffd94;
  value_type vVar6;
  allocator_type *in_stack_fffffffffffffda0;
  size_type in_stack_fffffffffffffda8;
  undefined1 *__n;
  vector<float,_std::allocator<float>_> *in_stack_fffffffffffffdb0;
  type *__f;
  float in_stack_fffffffffffffde8;
  int in_stack_fffffffffffffdec;
  int iVar7;
  value_type in_stack_fffffffffffffdf4;
  undefined1 *n_win_00;
  vector<float,_std::allocator<float>_> *data;
  ulong local_1b0;
  vector<float,_std::allocator<float>_> local_1a8;
  byte local_18d;
  int local_18c;
  int local_188;
  int *local_180;
  int *local_178;
  vector<float,_std::allocator<float>_> *local_170;
  int *local_168;
  undefined1 *local_160;
  vector<float,_std::allocator<float>_> *local_158;
  undefined1 *local_150;
  int local_140;
  undefined1 local_139;
  vector<std::thread,_std::allocator<std::thread>_> local_138;
  undefined1 local_119 [61];
  int local_dc;
  int local_d8;
  float local_d4;
  float local_d0;
  int local_cc;
  int local_c8;
  int local_c4;
  int local_c0;
  undefined1 local_b9;
  vector<float,_std::allocator<float>_> local_b8;
  undefined1 local_99 [33];
  vector<float,_std::allocator<float>_> local_78;
  int local_60;
  vector<float,_std::allocator<float>_> local_48;
  int local_30;
  undefined4 local_2c;
  undefined4 local_28;
  undefined4 local_24;
  undefined4 local_20;
  int local_1c;
  int local_18;
  int local_14;
  long local_10;
  
  local_20 = 0x500;
  local_24 = 0x140;
  local_28 = 0x500;
  local_2c = 0x1e0;
  local_30 = in_EDX * 0x140 + 0x3c0;
  local_1c = in_R8D;
  local_18 = in_ECX;
  local_14 = in_EDX;
  local_10 = in_RSI;
  std::allocator<float>::allocator((allocator<float> *)0x18151c);
  std::vector<float,_std::allocator<float>_>::vector
            (in_stack_fffffffffffffdb0,in_stack_fffffffffffffda8,in_stack_fffffffffffffda0);
  std::allocator<float>::~allocator((allocator<float> *)0x181545);
  std::vector<float,_std::allocator<float>_>::size(&local_48);
  std::vector<float,_std::allocator<float>_>::data
            ((vector<float,_std::allocator<float>_> *)0x18156e);
  fill_hann_window(in_stack_fffffffffffffd94,SUB41((uint)in_stack_fffffffffffffd90 >> 0x18,0),
                   (float *)in_stack_fffffffffffffd88);
  local_60 = local_18 * local_14;
  std::allocator<float>::allocator((allocator<float> *)0x1815c1);
  std::vector<float,_std::allocator<float>_>::vector
            (in_stack_fffffffffffffdb0,in_stack_fffffffffffffda8,in_stack_fffffffffffffda0);
  std::allocator<float>::~allocator((allocator<float> *)0x1815ed);
  n_out_00 = (long)local_60;
  data = (vector<float,_std::allocator<float>_> *)local_99;
  std::allocator<float>::allocator((allocator<float> *)0x181612);
  std::vector<float,_std::allocator<float>_>::vector
            (in_stack_fffffffffffffdb0,in_stack_fffffffffffffda8,in_stack_fffffffffffffda0);
  std::allocator<float>::~allocator((allocator<float> *)0x18163e);
  n_hop_00 = (long)local_60;
  n_win_00 = &local_b9;
  std::allocator<float>::allocator((allocator<float> *)0x18165d);
  std::vector<float,_std::allocator<float>_>::vector
            (in_stack_fffffffffffffdb0,in_stack_fffffffffffffda8,in_stack_fffffffffffffda0);
  std::allocator<float>::~allocator((allocator<float> *)0x181683);
  for (local_c0 = 0; local_c0 < local_14; local_c0 = local_c0 + 1) {
    for (local_c4 = 0; local_c4 < local_18; local_c4 = local_c4 + 1) {
      in_stack_fffffffffffffdf4 =
           *(value_type *)(local_10 + (long)(local_c0 * local_18 + local_c4) * 4);
      pvVar1 = std::vector<float,_std::allocator<float>_>::operator[]
                         (&local_78,(long)(local_c4 * local_14 + local_c0));
      *pvVar1 = in_stack_fffffffffffffdf4;
    }
  }
  for (local_c8 = 0; local_c8 < local_18 / 2; local_c8 = local_c8 + 1) {
    for (local_cc = 0; local_cc < local_14; local_cc = local_cc + 1) {
      pvVar1 = std::vector<float,_std::allocator<float>_>::operator[]
                         (&local_78,(long)(local_c8 * local_14 + local_cc));
      local_d0 = *pvVar1;
      in_stack_fffffffffffffdec = local_c8;
      pvVar1 = std::vector<float,_std::allocator<float>_>::operator[]
                         (&local_78,(long)((local_c8 + local_18 / 2) * local_14 + local_cc));
      local_d4 = *pvVar1;
      dVar5 = exp((double)local_d0);
      local_d0 = (float)dVar5;
      if (100.0 < local_d0) {
        local_d0 = 100.0;
      }
      fVar4 = local_d0;
      fVar3 = cosf(local_d4);
      pvVar1 = std::vector<float,_std::allocator<float>_>::operator[]
                         ((vector<float,_std::allocator<float>_> *)(local_99 + 1),
                          (long)((local_c8 * local_14 + local_cc) * 2));
      in_stack_fffffffffffffde8 = local_d0;
      *pvVar1 = fVar4 * fVar3;
      fVar4 = sinf(local_d4);
      in_stack_fffffffffffffde8 = in_stack_fffffffffffffde8 * fVar4;
      pvVar1 = std::vector<float,_std::allocator<float>_>::operator[]
                         ((vector<float,_std::allocator<float>_> *)(local_99 + 1),
                          (long)((local_c8 * local_14 + local_cc) * 2 + 1));
      *pvVar1 = in_stack_fffffffffffffde8;
    }
  }
  iVar7 = local_c8;
  for (local_d8 = 0; local_d8 < local_14; local_d8 = local_d8 + 1) {
    for (local_dc = 0; local_dc < local_18 / 2; local_dc = local_dc + 1) {
      pvVar1 = std::vector<float,_std::allocator<float>_>::operator[]
                         ((vector<float,_std::allocator<float>_> *)(local_99 + 1),
                          (long)((local_dc * local_14 + local_d8) * 2));
      vVar6 = *pvVar1;
      pvVar1 = std::vector<float,_std::allocator<float>_>::operator[]
                         (&local_b8,(long)(local_d8 * local_18 + local_dc * 2));
      *pvVar1 = vVar6;
      pvVar1 = std::vector<float,_std::allocator<float>_>::operator[]
                         ((vector<float,_std::allocator<float>_> *)(local_99 + 1),
                          (long)((local_dc * local_14 + local_d8) * 2 + 1));
      vVar6 = *pvVar1;
      pvVar1 = std::vector<float,_std::allocator<float>_>::operator[]
                         (&local_b8,(long)(local_d8 * local_18 + local_dc * 2 + 1));
      *pvVar1 = vVar6;
    }
  }
  this = (thread *)(long)(local_14 * 0x500);
  std::allocator<float>::allocator((allocator<float> *)0x181b92);
  std::vector<float,_std::allocator<float>_>::vector
            (in_stack_fffffffffffffdb0,in_stack_fffffffffffffda8,in_stack_fffffffffffffda0);
  std::allocator<float>::~allocator((allocator<float> *)0x181bb8);
  this_00 = (vector<float,_std::allocator<float>_> *)(long)(local_14 * 0x500);
  __f = (type *)local_119;
  std::allocator<float>::allocator((allocator<float> *)0x181be0);
  std::vector<float,_std::allocator<float>_>::vector
            (this_00,in_stack_fffffffffffffda8,in_stack_fffffffffffffda0);
  std::allocator<float>::~allocator((allocator<float> *)0x181c06);
  __a = (allocator_type *)(long)local_1c;
  __n = &local_139;
  std::allocator<std::thread>::allocator((allocator<std::thread> *)0x181c25);
  std::vector<std::thread,_std::allocator<std::thread>_>::vector
            ((vector<std::thread,_std::allocator<std::thread>_> *)this_00,(size_type)__n,__a);
  std::allocator<std::thread>::~allocator((allocator<std::thread> *)0x181c4b);
  for (local_140 = 0; local_140 < local_1c; local_140 = local_140 + 1) {
    local_188 = local_140;
    local_180 = &local_14;
    local_178 = &local_1c;
    local_170 = &local_b8;
    local_168 = &local_18;
    local_160 = local_119 + 0x21;
    local_158 = &local_48;
    local_150 = local_119 + 1;
    std::thread::thread<embd_to_audio(float_const*,int,int,int)::__0,,void>(this,__f);
    std::vector<std::thread,_std::allocator<std::thread>_>::operator[](&local_138,(long)local_140);
    std::thread::operator=
              ((thread *)CONCAT44(in_stack_fffffffffffffd94,in_stack_fffffffffffffd90),
               in_stack_fffffffffffffd88);
    std::thread::~thread((thread *)0x181d31);
  }
  for (local_18c = 0; local_18c < local_1c; local_18c = local_18c + 1) {
    std::vector<std::thread,_std::allocator<std::thread>_>::operator[](&local_138,(long)local_18c);
    std::thread::join();
  }
  local_18d = 0;
  std::vector<float,_std::allocator<float>_>::vector
            ((vector<float,_std::allocator<float>_> *)0x181e36);
  std::vector<float,_std::allocator<float>_>::vector
            ((vector<float,_std::allocator<float>_> *)0x181e43);
  fold(data,n_out_00,(int64_t)n_win_00,n_hop_00,CONCAT44(in_stack_fffffffffffffdf4,iVar7),
       (vector<float,_std::allocator<float>_> *)
       CONCAT44(in_stack_fffffffffffffdec,in_stack_fffffffffffffde8));
  fold(data,n_out_00,(int64_t)n_win_00,n_hop_00,CONCAT44(in_stack_fffffffffffffdf4,iVar7),
       (vector<float,_std::allocator<float>_> *)
       CONCAT44(in_stack_fffffffffffffdec,in_stack_fffffffffffffde8));
  local_1b0 = 0;
  while( true ) {
    sVar2 = std::vector<float,_std::allocator<float>_>::size(in_RDI);
    if (sVar2 <= local_1b0) break;
    pvVar1 = std::vector<float,_std::allocator<float>_>::operator[](&local_1a8,local_1b0);
    vVar6 = *pvVar1;
    pvVar1 = std::vector<float,_std::allocator<float>_>::operator[](in_RDI,local_1b0);
    *pvVar1 = *pvVar1 / vVar6;
    local_1b0 = local_1b0 + 1;
  }
  local_18d = 1;
  std::vector<float,_std::allocator<float>_>::~vector((vector<float,_std::allocator<float>_> *)__a);
  if ((local_18d & 1) == 0) {
    std::vector<float,_std::allocator<float>_>::~vector
              ((vector<float,_std::allocator<float>_> *)__a);
  }
  std::vector<std::thread,_std::allocator<std::thread>_>::~vector
            ((vector<std::thread,_std::allocator<std::thread>_> *)__a);
  std::vector<float,_std::allocator<float>_>::~vector((vector<float,_std::allocator<float>_> *)__a);
  std::vector<float,_std::allocator<float>_>::~vector((vector<float,_std::allocator<float>_> *)__a);
  std::vector<float,_std::allocator<float>_>::~vector((vector<float,_std::allocator<float>_> *)__a);
  std::vector<float,_std::allocator<float>_>::~vector((vector<float,_std::allocator<float>_> *)__a);
  std::vector<float,_std::allocator<float>_>::~vector((vector<float,_std::allocator<float>_> *)__a);
  std::vector<float,_std::allocator<float>_>::~vector((vector<float,_std::allocator<float>_> *)__a);
  return in_RDI;
}

Assistant:

static std::vector<float> embd_to_audio(
        const float * embd,
        const int n_codes,
        const int n_embd,
        const int n_thread) {
    const int n_fft = 1280;
    const int n_hop = 320;
    const int n_win = 1280;
    const int n_pad = (n_win - n_hop)/2;
    const int n_out = (n_codes - 1)*n_hop + n_win;

    std::vector<float> hann(n_fft);

    fill_hann_window(hann.size(), true, hann.data());

    int n_spec = n_embd*n_codes;

    std::vector<float> E (n_spec);
    std::vector<float> S (n_spec);
    std::vector<float> ST(n_spec);

    for (int l = 0; l < n_codes; ++l) {
        for (int k = 0; k < n_embd; ++k) {
            E[k*n_codes + l] = embd[l*n_embd + k];
        }
    }

    for (int k = 0; k < n_embd/2; ++k) {
        for (int l = 0; l < n_codes; ++l) {
            float mag = E[(k           )*n_codes + l];
            float phi = E[(k + n_embd/2)*n_codes + l];

            mag = exp(mag);

            if (mag > 1e2) {
                mag = 1e2;
            }
            S[2*(k*n_codes + l) + 0] = mag*cosf(phi);
            S[2*(k*n_codes + l) + 1] = mag*sinf(phi);
        }
    }

    for (int l = 0; l < n_codes; ++l) {
        for (int k = 0; k < n_embd/2; ++k) {
            ST[l*n_embd + 2*k + 0] = S[2*(k*n_codes + l) + 0];
            ST[l*n_embd + 2*k + 1] = S[2*(k*n_codes + l) + 1];
        }
    }

    std::vector<float> res  (n_codes*n_fft);
    std::vector<float> hann2(n_codes*n_fft);

    std::vector<std::thread> workers(n_thread);
    for (int i = 0; i < n_thread; ++i) {
        workers[i] = std::thread([&, i]() {
            for (int l = i; l < n_codes; l += n_thread) {
                irfft(n_fft, ST.data() + l*n_embd, res.data() + l*n_fft);
                for (int j = 0; j < n_fft; ++j) {
                    res  [l*n_fft + j] *= hann[j];
                    hann2[l*n_fft + j]  = hann[j] * hann[j];
                }
            }
        });
    }
    for (int i = 0; i < n_thread; ++i) {
        workers[i].join();
    }

    std::vector<float> audio;
    std::vector<float> env;

    fold(res,   n_out, n_win, n_hop, n_pad, audio);
    fold(hann2, n_out, n_win, n_hop, n_pad, env); // TODO: can be done once

    for (size_t i = 0; i < audio.size(); ++i) {
        audio[i] /= env[i];
    }

    return audio;
}